

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_node_input(Impl *this)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Id type;
  Id IVar4;
  Id IVar5;
  Id IVar6;
  Builder *pBVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  Builder *this_00;
  char buffer [4096];
  Vector<Id> local_1050;
  Vector<Id> local_1038 [171];
  
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  IVar2 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  IVar3 = spv::Builder::makeVectorType(pBVar7,IVar2,2);
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  type = spv::Builder::makeIntegerType(pBVar7,0x40,false);
  if ((this->node_input).payload_stride != 0) {
    IVar4 = SPIRVModule::create_variable
                      (this->spirv_module,StorageClassPrivate,type,"NodeInputPayloadBDA");
    (this->node_input).private_bda_var_id = IVar4;
    IVar4 = SPIRVModule::create_variable
                      (this->spirv_module,StorageClassPrivate,IVar2,"NodeInputStride");
    (this->node_input).private_stride_var_id = IVar4;
  }
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  IVar4 = spv::Builder::makeVectorType(pBVar7,IVar2,3);
  IVar5 = SPIRVModule::create_variable(this->spirv_module,StorageClassPrivate,IVar4,"WorkgroupID");
  IVar4 = SPIRVModule::create_variable
                    (this->spirv_module,StorageClassPrivate,IVar4,"GlobalInvocationID");
  SPIRVModule::register_builtin_shader_input(this->spirv_module,IVar5,BuiltInWorkgroupId);
  SPIRVModule::register_builtin_shader_input(this->spirv_module,IVar4,BuiltInGlobalInvocationId);
  bVar1 = (this->options).inline_ubo_enable;
  if (bVar1 == false) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_node_input();
    }
    else {
      memcpy(local_1038,
             "When compiling for nodes, inline UBO path must be enabled for root parameters.\n",0x50
            );
      pvVar9 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar9,Error,(char *)local_1038);
    }
  }
  else {
    IVar4 = emit_shader_record_buffer_block_type(this,true);
    (this->node_input).shader_record_block_type_id = IVar4;
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    if (IVar4 == 0) {
      this_00 = SPIRVModule::get_builder(this->spirv_module);
      IVar4 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar4 = spv::Builder::makeVectorType(pBVar7,IVar4,2);
    }
    else {
      IVar4 = spv::Builder::makePointer
                        (pBVar7,StorageClassPhysicalStorageBuffer,
                         (this->node_input).shader_record_block_type_id);
    }
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    IVar5 = spv::Builder::makeRuntimeArray(pBVar7,IVar2);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar7,IVar5,DecorationArrayStride,4);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar2;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    IVar6 = spv::Builder::makeStructType(pBVar7,local_1038,"NodeReadonlyU32Ptr");
    if (local_1038[0].
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar7,IVar6,DecorationBlock,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar6,0,DecorationOffset,0);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar6,0,DecorationNonWritable,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar6,0,"value");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    IVar6 = spv::Builder::makePointer(pBVar7,StorageClassPhysicalStorageBuffer,IVar6);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar5;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    IVar5 = spv::Builder::makeStructType(pBVar7,local_1038,"NodeReadonlyU32ArrayPtr");
    if (local_1038[0].
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar7,IVar5,DecorationBlock,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar5,0,DecorationOffset,0);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar5,0,DecorationNonWritable,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar5,0,"offsets");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    IVar5 = spv::Builder::makePointer(pBVar7,StorageClassPhysicalStorageBuffer,IVar5);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x24);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 9;
    *local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = type;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[1] = IVar6;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[2] = IVar6;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[3] = IVar3;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[4] = type;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[5] = type;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[6] = IVar4;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[7] = IVar2;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[8] = IVar2;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1038[0].
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    IVar3 = spv::Builder::makeStructType(pBVar7,local_1038,"NodeDispatchRegisters");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,0,DecorationOffset,0);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,1,DecorationOffset,8);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,2,DecorationOffset,0x10);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,3,DecorationOffset,0x18);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,4,DecorationOffset,0x20);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,5,DecorationOffset,0x28);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,6,DecorationOffset,0x30);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,7,DecorationOffset,0x38);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar3,8,DecorationOffset,0x3c);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,0,"PayloadLinearBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,1,"NodeLinearOffsetBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,2,"NodeEndNodesBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,3,"NodePayloadStrideOrOffsetsBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,4,"NodePayloadOutputBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,5,"NodePayloadOutputAtomicBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,6,"NodeLocalRootSignatureBDA");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,7,"NodePayloadOutputOffset");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar3,8,"NodeRemainingRecursionLevels");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar7,IVar3,DecorationBlock,-1);
    IVar3 = SPIRVModule::create_variable
                      (this->spirv_module,StorageClassPushConstant,IVar3,"NodeDispatch");
    (this->node_input).node_dispatch_push_id = IVar3;
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration
              (pBVar7,(this->node_input).node_dispatch_push_id,DecorationRestrictPointer,-1);
    IVar3 = SPIRVModule::create_variable
                      (this->spirv_module,StorageClassPrivate,IVar2,"NodeCoalesceOffset");
    (this->node_input).private_coalesce_offset_id = IVar3;
    IVar2 = SPIRVModule::create_variable
                      (this->spirv_module,StorageClassPrivate,IVar2,"NodeCoalesceCount");
    (this->node_input).private_coalesce_count_id = IVar2;
    (this->node_input).u32_ptr_type_id = IVar6;
    (this->node_input).u32_array_ptr_type_id = IVar5;
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
    local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
    *local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = type;
    local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    IVar2 = spv::Builder::makeStructType(pBVar7,&local_1050,"NodeReadonlyU64Ptr");
    if (local_1050.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_1050.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar7,IVar2,DecorationBlock,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar2,0,DecorationOffset,0);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar7,IVar2,0,DecorationNonWritable,-1);
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberName(pBVar7,IVar2,0,"value");
    pBVar7 = SPIRVModule::get_builder(this->spirv_module);
    IVar2 = spv::Builder::makePointer(pBVar7,StorageClassPhysicalStorageBuffer,IVar2);
    (this->node_input).u64_ptr_type_id = IVar2;
    if (local_1038[0].
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool Converter::Impl::emit_execution_modes_node_input()
{
	spv::Id u32_type_id = builder().makeUintType(32);
	spv::Id uvec2_type_id = builder().makeVectorType(u32_type_id, 2);
	spv::Id u64_type_id = builder().makeUintType(64);

	if (node_input.payload_stride)
	{
		node_input.private_bda_var_id = create_variable(
			spv::StorageClassPrivate, u64_type_id, "NodeInputPayloadBDA");
		node_input.private_stride_var_id = create_variable(
			spv::StorageClassPrivate, u32_type_id, "NodeInputStride");
	}

	// We have to rewrite global IDs. Local invocation should remain intact.
	spv::Id uvec3_type = builder().makeVectorType(u32_type_id, 3);
	spv::Id workgroup_id = create_variable(spv::StorageClassPrivate, uvec3_type, "WorkgroupID");
	spv::Id global_invocation_id = create_variable(spv::StorageClassPrivate, uvec3_type, "GlobalInvocationID");
	spirv_module.register_builtin_shader_input(workgroup_id, spv::BuiltInWorkgroupId);
	spirv_module.register_builtin_shader_input(global_invocation_id, spv::BuiltInGlobalInvocationId);

	// Emit binding model.
	// Push constants are our only option.
	if (!options.inline_ubo_enable)
	{
		LOGE("When compiling for nodes, inline UBO path must be enabled for root parameters.\n");
		return false;
	}

	node_input.shader_record_block_type_id = emit_shader_record_buffer_block_type(true);
	spv::Id ptr_shader_record_block_type_id = 0;
	if (node_input.shader_record_block_type_id)
	{
		ptr_shader_record_block_type_id =
			builder().makePointer(spv::StorageClassPhysicalStorageBuffer,
			                      node_input.shader_record_block_type_id);
	}
	else
	{
		// Dummy type
		ptr_shader_record_block_type_id = builder().makeVectorType(builder().makeUintType(32), 2);
	}

	// Declare the ABI for dispatching a node. This will change depending on the dispatch mode,
	// and style of execution (indirect pull or array).

	spv::Id u32_array_type_id = builder().makeRuntimeArray(u32_type_id);
	builder().addDecoration(u32_array_type_id, spv::DecorationArrayStride, 4);

	spv::Id u32_struct_type_id = builder().makeStructType({ u32_type_id }, "NodeReadonlyU32Ptr");
	builder().addDecoration(u32_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u32_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u32_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u32_struct_type_id, 0, "value");
	spv::Id u32_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u32_struct_type_id);

	spv::Id u32_array_struct_type_id = builder().makeStructType({ u32_array_type_id }, "NodeReadonlyU32ArrayPtr");
	builder().addDecoration(u32_array_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u32_array_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u32_array_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u32_array_struct_type_id, 0, "offsets");
	spv::Id u32_array_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u32_array_struct_type_id);

	const Vector<spv::Id> members = {
		u64_type_id,
		u32_ptr_type_id,
		u32_ptr_type_id,
		uvec2_type_id,
		u64_type_id,
		u64_type_id,
		ptr_shader_record_block_type_id,
		u32_type_id,
		u32_type_id,
	};

	spv::Id type_id = builder().makeStructType(members, "NodeDispatchRegisters");
	builder().addMemberDecoration(type_id, NodePayloadBDA, spv::DecorationOffset, 0);
	builder().addMemberDecoration(type_id, NodeLinearOffsetBDA, spv::DecorationOffset, 8);
	builder().addMemberDecoration(type_id, NodeEndNodesBDA, spv::DecorationOffset, 16);
	builder().addMemberDecoration(type_id, NodePayloadStrideOrOffsetsBDA, spv::DecorationOffset, 24);
	builder().addMemberDecoration(type_id, NodePayloadOutputBDA, spv::DecorationOffset, 32);
	builder().addMemberDecoration(type_id, NodePayloadOutputAtomicBDA, spv::DecorationOffset, 40);
	builder().addMemberDecoration(type_id, NodeLocalRootSignatureBDA, spv::DecorationOffset, 48);
	builder().addMemberDecoration(type_id, NodePayloadOutputOffset, spv::DecorationOffset, 56);
	builder().addMemberDecoration(type_id, NodeRemainingRecursionLevels, spv::DecorationOffset, 60);

	// For linear node layout (entry point).
	// Node payload is found at PayloadLinearBDA + NodeIndex * PayloadStride.
	builder().addMemberName(type_id, NodePayloadBDA, "PayloadLinearBDA");
	// With packed workgroup layout, need to apply an offset.
	builder().addMemberName(type_id, NodeLinearOffsetBDA, "NodeLinearOffsetBDA");
	// For thread and coalesce, need to know total number of threads to mask execution on edge.
	builder().addMemberName(type_id, NodeEndNodesBDA, "NodeEndNodesBDA");
	builder().addMemberName(type_id, NodePayloadStrideOrOffsetsBDA, "NodePayloadStrideOrOffsetsBDA");
	builder().addMemberName(type_id, NodePayloadOutputBDA, "NodePayloadOutputBDA");
	builder().addMemberName(type_id, NodePayloadOutputAtomicBDA, "NodePayloadOutputAtomicBDA");
	builder().addMemberName(type_id, NodeLocalRootSignatureBDA, "NodeLocalRootSignatureBDA");
	// For broadcast nodes. Need to instance multiple times.
	// Becomes WorkGroupID and affects GlobalInvocationID.
	builder().addMemberName(type_id, NodePayloadOutputOffset, "NodePayloadOutputOffset");
	builder().addMemberName(type_id, NodeRemainingRecursionLevels, "NodeRemainingRecursionLevels");
	builder().addDecoration(type_id, spv::DecorationBlock);
	node_input.node_dispatch_push_id =
	    create_variable(spv::StorageClassPushConstant, type_id, "NodeDispatch");
	builder().addDecoration(node_input.node_dispatch_push_id, spv::DecorationRestrictPointer);

	node_input.private_coalesce_offset_id =
		create_variable(spv::StorageClassPrivate, u32_type_id, "NodeCoalesceOffset");
	node_input.private_coalesce_count_id =
		create_variable(spv::StorageClassPrivate, u32_type_id, "NodeCoalesceCount");

	node_input.u32_ptr_type_id = u32_ptr_type_id;
	node_input.u32_array_ptr_type_id = u32_array_ptr_type_id;

	spv::Id u64_struct_type_id = builder().makeStructType({ u64_type_id }, "NodeReadonlyU64Ptr");
	builder().addDecoration(u64_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u64_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u64_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u64_struct_type_id, 0, "value");
	node_input.u64_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u64_struct_type_id);

	return true;
}